

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.h
# Opt level: O0

void __thiscall
slang::syntax::SpecparamDeclarationSyntax::SpecparamDeclarationSyntax
          (SpecparamDeclarationSyntax *this,
          SyntaxList<slang::syntax::AttributeInstanceSyntax> *attributes,Token keyword,
          ImplicitTypeSyntax *type,
          SeparatedSyntaxList<slang::syntax::SpecparamDeclaratorSyntax> *declarators,Token semi)

{
  Token TVar1;
  bool bVar2;
  ImplicitTypeSyntax *pIVar3;
  SpecparamDeclaratorSyntax *pSVar4;
  SpecparamDeclaratorSyntax *child;
  iterator __end2;
  iterator __begin2;
  SeparatedSyntaxList<slang::syntax::SpecparamDeclaratorSyntax> *__range2;
  SeparatedSyntaxList<slang::syntax::SpecparamDeclaratorSyntax> *local_38;
  SeparatedSyntaxList<slang::syntax::SpecparamDeclaratorSyntax> *declarators_local;
  ImplicitTypeSyntax *type_local;
  SyntaxList<slang::syntax::AttributeInstanceSyntax> *attributes_local;
  SpecparamDeclarationSyntax *this_local;
  Token keyword_local;
  
  TVar1 = semi;
  keyword_local._0_8_ = keyword.info;
  this_local = keyword._0_8_;
  local_38 = declarators;
  declarators_local = (SeparatedSyntaxList<slang::syntax::SpecparamDeclaratorSyntax> *)type;
  type_local = (ImplicitTypeSyntax *)attributes;
  attributes_local = (SyntaxList<slang::syntax::AttributeInstanceSyntax> *)this;
  MemberSyntax::MemberSyntax(&this->super_MemberSyntax,SpecparamDeclaration,attributes);
  *(SpecparamDeclarationSyntax **)&this->keyword = this_local;
  (this->keyword).info = (Info *)keyword_local._0_8_;
  __range2 = declarators_local;
  not_null<slang::syntax::ImplicitTypeSyntax*>::not_null<slang::syntax::ImplicitTypeSyntax*,void>
            ((not_null<slang::syntax::ImplicitTypeSyntax*> *)&this->type,
             (ImplicitTypeSyntax **)&__range2);
  SeparatedSyntaxList<slang::syntax::SpecparamDeclaratorSyntax>::SeparatedSyntaxList
            (&this->declarators,local_38);
  (this->semi).kind = semi.kind;
  (this->semi).field_0x2 = semi._2_1_;
  (this->semi).numFlags = (NumericTokenFlags)semi.numFlags.raw;
  (this->semi).rawLen = semi.rawLen;
  semi.info = TVar1.info;
  (this->semi).info = semi.info;
  pIVar3 = not_null<slang::syntax::ImplicitTypeSyntax_*>::operator->(&this->type);
  (pIVar3->super_DataTypeSyntax).super_ExpressionSyntax.super_SyntaxNode.parent = (SyntaxNode *)this
  ;
  (this->declarators).super_SyntaxListBase.super_SyntaxNode.parent = (SyntaxNode *)this;
  join_0x00000010_0x00000000_ =
       SeparatedSyntaxList<slang::syntax::SpecparamDeclaratorSyntax>::begin(&this->declarators);
  _child = SeparatedSyntaxList<slang::syntax::SpecparamDeclaratorSyntax>::end(&this->declarators);
  while( true ) {
    bVar2 = iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::SpecparamDeclaratorSyntax>::iterator_base<slang::syntax::SpecparamDeclaratorSyntax_*>,_std::random_access_iterator_tag,_slang::syntax::SpecparamDeclaratorSyntax_*,_unsigned_long,_slang::syntax::SpecparamDeclaratorSyntax_**,_slang::syntax::SpecparamDeclaratorSyntax_*&>
            ::operator!=((iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::SpecparamDeclaratorSyntax>::iterator_base<slang::syntax::SpecparamDeclaratorSyntax_*>,_std::random_access_iterator_tag,_slang::syntax::SpecparamDeclaratorSyntax_*,_unsigned_long,_slang::syntax::SpecparamDeclaratorSyntax_**,_slang::syntax::SpecparamDeclaratorSyntax_*&>
                          *)&__end2.index,
                         (iterator_base<slang::syntax::SpecparamDeclaratorSyntax_*> *)&child);
    if (!bVar2) break;
    pSVar4 = SeparatedSyntaxList<slang::syntax::SpecparamDeclaratorSyntax>::
             iterator_base<slang::syntax::SpecparamDeclaratorSyntax_*>::operator*
                       ((iterator_base<slang::syntax::SpecparamDeclaratorSyntax_*> *)&__end2.index);
    (pSVar4->super_SyntaxNode).parent = (SyntaxNode *)this;
    iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::SpecparamDeclaratorSyntax>::iterator_base<slang::syntax::SpecparamDeclaratorSyntax_*>,_std::random_access_iterator_tag,_slang::syntax::SpecparamDeclaratorSyntax_*,_unsigned_long,_slang::syntax::SpecparamDeclaratorSyntax_**,_slang::syntax::SpecparamDeclaratorSyntax_*&>
    ::operator++((iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::SpecparamDeclaratorSyntax>::iterator_base<slang::syntax::SpecparamDeclaratorSyntax_*>,_std::random_access_iterator_tag,_slang::syntax::SpecparamDeclaratorSyntax_*,_unsigned_long,_slang::syntax::SpecparamDeclaratorSyntax_**,_slang::syntax::SpecparamDeclaratorSyntax_*&>
                  *)&__end2.index);
  }
  return;
}

Assistant:

SpecparamDeclarationSyntax(const SyntaxList<AttributeInstanceSyntax>& attributes, Token keyword, ImplicitTypeSyntax& type, const SeparatedSyntaxList<SpecparamDeclaratorSyntax>& declarators, Token semi) :
        MemberSyntax(SyntaxKind::SpecparamDeclaration, attributes), keyword(keyword), type(&type), declarators(declarators), semi(semi) {
        this->type->parent = this;
        this->declarators.parent = this;
        for (auto child : this->declarators)
            child->parent = this;
    }